

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bestfit.cpp
# Opt level: O1

bool getBestFitPlane(uint vcount,float *points,uint vstride,float *weights,uint wstride,float *plane
                    )

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float *pfVar6;
  uint uVar7;
  float *pfVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float fVar19;
  Eigen kES;
  Eigen local_50;
  
  auVar9 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar15 = ZEXT816(0) << 0x40;
  auVar13 = ZEXT816(0) << 0x40;
  auVar11 = ZEXT816(0) << 0x40;
  local_50.mElement[2][2] = 0.0;
  if (vcount != 0) {
    pfVar6 = points + 2;
    pfVar8 = weights;
    uVar7 = vcount;
    do {
      if (pfVar8 == (float *)0x0) {
        auVar10 = SUB6416(ZEXT464(0x3f800000),0);
        pfVar8 = (float *)0x0;
      }
      else {
        auVar10 = ZEXT416((uint)*pfVar8);
        pfVar8 = (float *)((long)pfVar8 + (ulong)wstride);
      }
      auVar15 = vfmadd231ss_fma(auVar15,auVar10,ZEXT416((uint)pfVar6[-2]));
      auVar13 = vfmadd231ss_fma(auVar13,auVar10,ZEXT416((uint)pfVar6[-1]));
      auVar11 = vfmadd231ss_fma(auVar11,auVar10,ZEXT416((uint)*pfVar6));
      local_50.mElement[2][2] = local_50.mElement[2][2] + auVar10._0_4_;
      pfVar6 = (float *)((long)pfVar6 + (ulong)vstride);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  local_50.mElement[2][2] = 1.0 / local_50.mElement[2][2];
  fVar1 = auVar15._0_4_ * local_50.mElement[2][2];
  fVar2 = auVar13._0_4_ * local_50.mElement[2][2];
  fVar3 = auVar11._0_4_ * local_50.mElement[2][2];
  auVar18 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar16 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar14 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
  if (vcount != 0) {
    pfVar6 = points + 2;
    auVar9 = ZEXT464(0) << 0x40;
    do {
      if (weights == (float *)0x0) {
        weights = (float *)0x0;
        fVar19 = 1.0;
      }
      else {
        fVar19 = *weights;
        weights = (float *)((long)weights + (ulong)wstride);
      }
      fVar4 = fVar19 * (pfVar6[-2] - fVar1);
      fVar5 = fVar19 * (pfVar6[-1] - fVar2);
      fVar19 = fVar19 * (*pfVar6 - fVar3);
      auVar15 = vfmadd231ss_fma(auVar9._0_16_,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
      auVar9 = ZEXT1664(auVar15);
      auVar15 = vfmadd231ss_fma(auVar18._0_16_,ZEXT416((uint)fVar4),ZEXT416((uint)fVar5));
      auVar18 = ZEXT1664(auVar15);
      auVar15 = vfmadd231ss_fma(auVar17._0_16_,ZEXT416((uint)fVar19),ZEXT416((uint)fVar4));
      auVar17 = ZEXT1664(auVar15);
      auVar15 = vfmadd231ss_fma(auVar16._0_16_,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      auVar16 = ZEXT1664(auVar15);
      auVar15 = vfmadd231ss_fma(auVar14._0_16_,ZEXT416((uint)fVar19),ZEXT416((uint)fVar5));
      auVar14 = ZEXT1664(auVar15);
      auVar15 = vfmadd231ss_fma(auVar12._0_16_,ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
      auVar12 = ZEXT1664(auVar15);
      pfVar6 = (float *)((long)pfVar6 + (ulong)vstride);
      vcount = vcount - 1;
    } while (vcount != 0);
  }
  local_50.mElement[0][0] = local_50.mElement[2][2] * auVar9._0_4_;
  local_50.mElement[0][1] = local_50.mElement[2][2] * auVar18._0_4_;
  local_50.mElement[0][2] = local_50.mElement[2][2] * auVar17._0_4_;
  local_50.mElement[1][1] = local_50.mElement[2][2] * auVar16._0_4_;
  local_50.mElement[1][2] = local_50.mElement[2][2] * auVar14._0_4_;
  local_50.mElement[2][2] = local_50.mElement[2][2] * auVar12._0_4_;
  local_50.mElement[1][0] = local_50.mElement[0][1];
  local_50.mElement[2][0] = local_50.mElement[0][2];
  local_50.mElement[2][1] = local_50.mElement[1][2];
  BestFit::Eigen::DecrSortEigenStuff(&local_50);
  *plane = local_50.mElement[0][2];
  plane[1] = local_50.mElement[1][2];
  plane[2] = local_50.mElement[2][2];
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)local_50.mElement[0][2]),
                            ZEXT416((uint)(local_50.mElement[1][2] * fVar2)));
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)local_50.mElement[2][2]),auVar15);
  plane[3] = 0.0 - auVar15._0_4_;
  return false;
}

Assistant:

bool getBestFitPlane(unsigned int vcount,
                     const float *points,
                     unsigned int vstride,
                     const float *weights,
                     unsigned int wstride,
                     float *plane)
{
  bool ret = false;

  Vec3 kOrigin(0,0,0);

  float wtotal = 0;

  if ( 1 )
  {
    const char *source  = (const char *) points;
    const char *wsource = (const char *) weights;

    for (unsigned int i=0; i<vcount; i++)
    {

      const float *p = (const float *) source;

      float w = 1;

      if ( wsource )
      {
        const float *ws = (const float *) wsource;
        w = *ws; //
        wsource+=wstride;
      }

      kOrigin.x+=p[0]*w;
      kOrigin.y+=p[1]*w;
      kOrigin.z+=p[2]*w;

      wtotal+=w;

      source+=vstride;
    }
  }

  float recip = 1.0f / wtotal; // reciprocol of total weighting

  kOrigin.x*=recip;
  kOrigin.y*=recip;
  kOrigin.z*=recip;


  float fSumXX=0;
  float fSumXY=0;
  float fSumXZ=0;

  float fSumYY=0;
  float fSumYZ=0;
  float fSumZZ=0;


  if ( 1 )
  {
    const char *source  = (const char *) points;
    const char *wsource = (const char *) weights;

    for (unsigned int i=0; i<vcount; i++)
    {

      const float *p = (const float *) source;

      float w = 1;

      if ( wsource )
      {
        const float *ws = (const float *) wsource;
        w = *ws; //
        wsource+=wstride;
      }

      Vec3 kDiff;

      kDiff.x = w*(p[0] - kOrigin.x); // apply vertex weighting!
      kDiff.y = w*(p[1] - kOrigin.y);
      kDiff.z = w*(p[2] - kOrigin.z);

      fSumXX+= kDiff.x * kDiff.x; // sume of the squares of the differences.
      fSumXY+= kDiff.x * kDiff.y; // sume of the squares of the differences.
      fSumXZ+= kDiff.x * kDiff.z; // sume of the squares of the differences.

      fSumYY+= kDiff.y * kDiff.y;
      fSumYZ+= kDiff.y * kDiff.z;
      fSumZZ+= kDiff.z * kDiff.z;


      source+=vstride;
    }
  }

  fSumXX *= recip;
  fSumXY *= recip;
  fSumXZ *= recip;
  fSumYY *= recip;
  fSumYZ *= recip;
  fSumZZ *= recip;

  // setup the eigensolver
  Eigen kES;

  kES.mElement[0][0] = fSumXX;
  kES.mElement[0][1] = fSumXY;
  kES.mElement[0][2] = fSumXZ;

  kES.mElement[1][0] = fSumXY;
  kES.mElement[1][1] = fSumYY;
  kES.mElement[1][2] = fSumYZ;

  kES.mElement[2][0] = fSumXZ;
  kES.mElement[2][1] = fSumYZ;
  kES.mElement[2][2] = fSumZZ;

  // compute eigenstuff, smallest eigenvalue is in last position
  kES.DecrSortEigenStuff();

  Vec3 kNormal;

  kNormal.x = kES.mElement[0][2];
  kNormal.y = kES.mElement[1][2];
  kNormal.z = kES.mElement[2][2];

  // the minimum energy
  plane[0] = kNormal.x;
  plane[1] = kNormal.y;
  plane[2] = kNormal.z;

  plane[3] = 0 - kNormal.dot(kOrigin);

  return ret;
}